

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.h
# Opt level: O2

bool __thiscall
slang::analysis::DataFlowAnalysis::isReferenced(DataFlowAnalysis *this,ValueSymbol *symbol)

{
  char *pcVar1;
  undefined4 uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  ulong uVar8;
  value_type *elements_1;
  ulong uVar9;
  long lVar10;
  value_type *elements;
  ulong uVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = symbol;
  uVar8 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar9 = uVar8 >> ((this->symbolToSlot).field_0x50 & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar8 & 0xff];
  uVar3 = *(ulong *)&(this->symbolToSlot).field_0x58;
  uVar11 = 0;
  do {
    pcVar1 = (char *)(*(long *)&(this->symbolToSlot).field_0x60 + uVar9 * 0x10);
    cVar12 = (char)uVar2;
    auVar16[0] = -(*pcVar1 == cVar12);
    cVar13 = (char)((uint)uVar2 >> 8);
    auVar16[1] = -(pcVar1[1] == cVar13);
    cVar14 = (char)((uint)uVar2 >> 0x10);
    auVar16[2] = -(pcVar1[2] == cVar14);
    bVar15 = (byte)((uint)uVar2 >> 0x18);
    auVar16[3] = -(pcVar1[3] == bVar15);
    auVar16[4] = -(pcVar1[4] == cVar12);
    auVar16[5] = -(pcVar1[5] == cVar13);
    auVar16[6] = -(pcVar1[6] == cVar14);
    auVar16[7] = -(pcVar1[7] == bVar15);
    auVar16[8] = -(pcVar1[8] == cVar12);
    auVar16[9] = -(pcVar1[9] == cVar13);
    auVar16[10] = -(pcVar1[10] == cVar14);
    auVar16[0xb] = -(pcVar1[0xb] == bVar15);
    auVar16[0xc] = -(pcVar1[0xc] == cVar12);
    auVar16[0xd] = -(pcVar1[0xd] == cVar13);
    auVar16[0xe] = -(pcVar1[0xe] == cVar14);
    auVar16[0xf] = -(pcVar1[0xf] == bVar15);
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
    if (uVar7 != 0) {
      do {
        iVar4 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
          }
        }
        if (*(ValueSymbol **)
             (*(long *)&(this->symbolToSlot).field_0x68 + uVar9 * 0xf0 + (ulong)(uint)(iVar4 << 4))
            == symbol) {
          return true;
        }
        uVar7 = uVar7 - 1 & uVar7;
      } while (uVar7 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & pcVar1[0xf]) == 0) break;
    lVar10 = uVar9 + uVar11;
    uVar11 = uVar11 + 1;
    uVar9 = lVar10 + 1U & uVar3;
  } while (uVar11 <= uVar3);
  uVar9 = uVar8 >> ((this->rvalues).field_0x130 & 0x3f);
  uVar3 = *(ulong *)&(this->rvalues).field_0x138;
  uVar11 = 0;
  do {
    pcVar1 = (char *)(*(long *)&(this->rvalues).field_0x140 + uVar9 * 0x10);
    auVar17[0] = -(*pcVar1 == cVar12);
    auVar17[1] = -(pcVar1[1] == cVar13);
    auVar17[2] = -(pcVar1[2] == cVar14);
    auVar17[3] = -(pcVar1[3] == bVar15);
    auVar17[4] = -(pcVar1[4] == cVar12);
    auVar17[5] = -(pcVar1[5] == cVar13);
    auVar17[6] = -(pcVar1[6] == cVar14);
    auVar17[7] = -(pcVar1[7] == bVar15);
    auVar17[8] = -(pcVar1[8] == cVar12);
    auVar17[9] = -(pcVar1[9] == cVar13);
    auVar17[10] = -(pcVar1[10] == cVar14);
    auVar17[0xb] = -(pcVar1[0xb] == bVar15);
    auVar17[0xc] = -(pcVar1[0xc] == cVar12);
    auVar17[0xd] = -(pcVar1[0xd] == cVar13);
    auVar17[0xe] = -(pcVar1[0xe] == cVar14);
    auVar17[0xf] = -(pcVar1[0xf] == bVar15);
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    if (uVar7 != 0) {
      do {
        uVar5 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        if (*(ValueSymbol **)
             (*(long *)&(this->rvalues).field_0x148 + uVar9 * 0x438 + (ulong)uVar5 * 0x48) == symbol
           ) {
          return true;
        }
        uVar7 = uVar7 - 1 & uVar7;
      } while (uVar7 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & pcVar1[0xf]) == 0) {
      return false;
    }
    lVar10 = uVar9 + uVar11;
    uVar11 = uVar11 + 1;
    uVar9 = lVar10 + 1U & uVar3;
  } while (uVar11 <= uVar3);
  return false;
}

Assistant:

bool isReferenced(const ValueSymbol& symbol) const {
        return symbolToSlot.contains(&symbol) || rvalues.contains(&symbol);
    }